

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

int __thiscall CDefineTable::Remove(CDefineTable *this,char *name)

{
  byte bVar1;
  CDefineTableEntry *this_00;
  int iVar2;
  CDefineTableEntry **ppCVar3;
  CDefineTableEntry *pCVar4;
  
  bVar1 = *name;
  ppCVar3 = this->defs + (bVar1 & 0x7f);
  pCVar4 = (CDefineTableEntry *)0x0;
  while( true ) {
    this_00 = *ppCVar3;
    if (this_00 == (CDefineTableEntry *)0x0) {
      return 0;
    }
    iVar2 = strcmp(name,this_00->name);
    if (iVar2 == 0) break;
    ppCVar3 = &this_00->next;
    pCVar4 = this_00;
  }
  ppCVar3 = &pCVar4->next;
  if (pCVar4 == (CDefineTableEntry *)0x0) {
    ppCVar3 = this->defs + (bVar1 & 0x7f);
  }
  *ppCVar3 = this_00->next;
  this_00->next = (CDefineTableEntry *)0x0;
  CDefineTableEntry::~CDefineTableEntry(this_00);
  operator_delete(this_00,0x20);
  this->DefArrayList = (CStringsList *)0x0;
  return 1;
}

Assistant:

int CDefineTable::Remove(const char* name) {
	CDefineTableEntry* p = defs[(*name)&127];
	CDefineTableEntry* p2 = NULL;
	while (p) {
		if (!strcmp(name, p->name)) {
			// unchain the particular item
			if (NULL == p2) defs[(*name)&127] = p->next;
			else			p2->next = p->next;
			p->next = NULL;
			// delete it
			delete p;
			DefArrayList = NULL;		// may be invalid here, so just reset it
			return 1;
		}
		p2 = p;
		p = p->next;
	}
	return 0;
}